

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O3

void __thiscall CMU462::PathTracer::visualize_accel(PathTracer *this)

{
  BVHNode *this_00;
  _Elt_pointer ppBVar1;
  pointer pLVar2;
  pointer pLVar3;
  ulong uVar4;
  BVHNode *pBVar5;
  BVHNode *pBVar6;
  long lVar7;
  double dVar8;
  Color c;
  Color c_00;
  Color c_01;
  Color c_02;
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  tstack;
  double local_f0;
  _Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  local_e8;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  undefined8 local_68;
  BVHNode *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  glPushAttrib(0x2000);
  glDisable(0xb50);
  glBlendFunc(1);
  glLineWidth(0x3a83126f);
  glEnable(0xb71);
  local_58 = 0x3f19999a3f19999a;
  uStack_50 = 0x3f8000003f800000;
  local_38 = 0x3f4ccccd3f4ccccd;
  uStack_30 = 0x3f8000003f800000;
  local_48 = 0;
  uStack_40 = 0x3f00000000000000;
  ppBVar1 = (this->selectionHistory).c.
            super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar1 ==
      (this->selectionHistory).c.
      super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppBVar1 = (this->selectionHistory).c.
              super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  this_00 = ppBVar1[-1];
  glPolygonOffset(0x3f800000,0x3f800000);
  glEnable(0x8037);
  pBVar6 = this_00->l;
  pBVar5 = this_00->r;
  if (pBVar6 == (BVHNode *)0x0 && pBVar5 == (BVHNode *)0x0) {
    if (this_00->range != 0) {
      uVar4 = 0;
      do {
        (*(this->bvh->super_Aggregate).primitives.
          super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          ._M_impl.super__Vector_impl_data._M_start[this_00->start + uVar4]->_vptr_Primitive[4])();
        uVar4 = uVar4 + 1;
      } while (uVar4 < this_00->range);
    }
  }
  else {
    if ((pBVar6 != (BVHNode *)0x0) && (pBVar6->range != 0)) {
      uVar4 = 0;
      do {
        (*(this->bvh->super_Aggregate).primitives.
          super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          ._M_impl.super__Vector_impl_data._M_start[pBVar6->start + uVar4]->_vptr_Primitive[4])();
        uVar4 = uVar4 + 1;
      } while (uVar4 < pBVar6->range);
      pBVar5 = this_00->r;
    }
    if ((pBVar5 != (BVHNode *)0x0) && (pBVar5->range != 0)) {
      uVar4 = 0;
      do {
        (*(this->bvh->super_Aggregate).primitives.
          super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          ._M_impl.super__Vector_impl_data._M_start[pBVar5->start + uVar4]->_vptr_Primitive[4])();
        uVar4 = uVar4 + 1;
      } while (uVar4 < pBVar5->range);
    }
  }
  glDisable(0x8037);
  if (this_00->range != 0) {
    uVar4 = 0;
    do {
      (*(this->bvh->super_Aggregate).primitives.
        super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
        ._M_impl.super__Vector_impl_data._M_start[this_00->start + uVar4]->_vptr_Primitive[5])();
      uVar4 = uVar4 + 1;
    } while (uVar4 < this_00->range);
  }
  glDepthMask(0);
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ::_M_initialize_map(&local_e8,0);
  local_60 = this->bvh->root;
  if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>::
    _M_push_back_aux<CMU462::StaticScene::BVHNode*>
              ((deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>> *
               )&local_e8,&local_60);
  }
  else {
    *local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_60;
    local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pBVar6 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
        operator_delete(local_e8._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        pBVar6 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      c.b = 0.5;
      c.a = 0.25;
      c.r = 0.5;
      c.g = 0.5;
      BBox::draw(&pBVar6->bb,c);
      if (pBVar6->l != (BVHNode *)0x0) {
        if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>::
          _M_push_back_aux<CMU462::StaticScene::BVHNode*const&>
                    ((deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>
                      *)&local_e8,&pBVar6->l);
        }
        else {
          *local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = pBVar6->l;
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      if (pBVar6->r != (BVHNode *)0x0) {
        if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>::
          _M_push_back_aux<CMU462::StaticScene::BVHNode*const&>
                    ((deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>
                      *)&local_e8,&pBVar6->r);
        }
        else {
          *local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = pBVar6->r;
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
    } while (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if (this_00->l != (BVHNode *)0x0) {
    c_00.b = 1.0;
    c_00.a = 0.6;
    c_00.r = 1.0;
    c_00.g = 1.0;
    BBox::draw(&this_00->l->bb,c_00);
  }
  if (this_00->r != (BVHNode *)0x0) {
    c_01.b = 1.0;
    c_01.a = 0.6;
    c_01.r = 1.0;
    c_01.g = 1.0;
    BBox::draw(&this_00->r->bb,c_01);
  }
  glLineWidth(0x40400000);
  c_02.b = 0.0;
  c_02.a = 0.6;
  c_02.r = 1.0;
  c_02.g = 0.25;
  BBox::draw(&this_00->bb,c_02);
  if (this->show_rays == true) {
    glLineWidth(0x3f800000);
    glBegin(1);
    pLVar2 = (this->rayLog).
             super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar3 = (this->rayLog).
             super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pLVar3 != pLVar2) {
      lVar7 = 0;
      uVar4 = 0;
      do {
        local_f0 = *(double *)((long)&pLVar2->hit_t + lVar7);
        if ((this->show_hitting_rays != false) || (0.0 <= local_f0)) {
          if (0.0 <= local_f0) {
            glColor4f(0x3f800000,0x3f800000,0,0x3dcccccd);
          }
          else {
            glColor4f(0x3f800000,0,0,0x3dcccccd);
            local_f0 = 100000.0;
          }
          pLVar2 = (this->rayLog).
                   super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl
                   .super__Vector_impl_data._M_start;
          local_78 = *(double *)((long)&(pLVar2->d).x + lVar7);
          local_70 = *(double *)((long)&(pLVar2->d).y + lVar7);
          local_68 = *(undefined8 *)((long)&(pLVar2->d).z + lVar7);
          local_80 = *(double *)((long)&(pLVar2->o).x + lVar7);
          local_88 = *(double *)((long)&(pLVar2->o).y + lVar7);
          local_90 = *(double *)((long)&(pLVar2->o).z + lVar7);
          glVertex3f((float)local_80,CONCAT44((int)((ulong)local_88 >> 0x20),(float)local_88),
                     CONCAT44((int)((ulong)local_90 >> 0x20),(float)local_90));
          dVar8 = local_70 * local_f0 + local_88;
          glVertex3f((float)(local_78 * local_f0 + local_80),
                     CONCAT44((int)((ulong)dVar8 >> 0x20),(float)dVar8));
          pLVar2 = (this->rayLog).
                   super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pLVar3 = (this->rayLog).
                   super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        }
        uVar4 = uVar4 + 500;
        lVar7 = lVar7 + 28000;
      } while (uVar4 < (ulong)(((long)pLVar3 - (long)pLVar2 >> 3) * 0x6db6db6db6db6db7));
    }
    glEnd();
  }
  glDepthMask(1);
  glPopAttrib();
  std::_Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ::~_Deque_base(&local_e8);
  return;
}

Assistant:

void PathTracer::visualize_accel() const {
  glPushAttrib(GL_ENABLE_BIT);
  glDisable(GL_LIGHTING);
  glBlendFunc(GL_ONE, GL_ZERO);
  glLineWidth(.001);
  glEnable(GL_DEPTH_TEST);

  // hardcoded color settings
  Color cnode = Color(.5, .5, .5, .25);
  Color cnode_hl = Color(1., .25, .0, .6);
  Color cnode_hl_child = Color(1., 1., 1., .6);

  Color cprim_hl_left = Color(.6, .6, 1., 1);
  Color cprim_hl_right = Color(.8, .8, 1., 1);
  Color cprim_hl_edges = Color(0., 0., 0., 0.5);

  BVHNode *selected = selectionHistory.top();

  // render solid geometry (with depth offset)
  glPolygonOffset(1.0, 1.0);
  glEnable(GL_POLYGON_OFFSET_FILL);

  if (selected->isLeaf()) {
    for (size_t i = 0; i < selected->range; ++i) {
      bvh->primitives[selected->start + i]->draw(cprim_hl_left);
    }
  } else {
    if (selected->l) {
      BVHNode *child = selected->l;
      for (size_t i = 0; i < child->range; ++i) {
        bvh->primitives[child->start + i]->draw(cprim_hl_left);
      }
    }
    if (selected->r) {
      BVHNode *child = selected->r;
      for (size_t i = 0; i < child->range; ++i) {
        bvh->primitives[child->start + i]->draw(cprim_hl_right);
      }
    }
  }

  glDisable(GL_POLYGON_OFFSET_FILL);

  // draw geometry outline
  for (size_t i = 0; i < selected->range; ++i) {
    bvh->primitives[selected->start + i]->drawOutline(cprim_hl_edges);
  }

  // keep depth buffer check enabled so that mesh occluded bboxes, but
  // disable depth write so that bboxes don't occlude each other.
  glDepthMask(GL_FALSE);

  // create traversal stack
  stack<BVHNode *> tstack;

  // push initial traversal data
  tstack.push(bvh->get_root());

  // draw all BVH bboxes with non-highlighted color
  while (!tstack.empty()) {
    BVHNode *current = tstack.top();
    tstack.pop();

    current->bb.draw(cnode);
    if (current->l) tstack.push(current->l);
    if (current->r) tstack.push(current->r);
  }

  // draw selected node bbox and primitives
  if (selected->l) selected->l->bb.draw(cnode_hl_child);
  if (selected->r) selected->r->bb.draw(cnode_hl_child);

  glLineWidth(3.f);
  selected->bb.draw(cnode_hl);

  // now perform visualization of the rays
  if (show_rays) {
    glLineWidth(1.f);
    glBegin(GL_LINES);

    for (size_t i = 0; i < rayLog.size(); i += 500) {
      const static double VERY_LONG = 10e4;
      double ray_t = VERY_LONG;

	  if (!show_hitting_rays && rayLog[i].hit_t < 0.0) continue;

      // color rays that are hits yellow
      // and rays this miss all geometry red
      if (rayLog[i].hit_t >= 0.0) {
        ray_t = rayLog[i].hit_t;
        glColor4f(1.f, 1.f, 0.f, 0.1f);
      } else {
        glColor4f(1.f, 0.f, 0.f, 0.1f);
      }

      Vector3D end = rayLog[i].o + ray_t * rayLog[i].d;

      glVertex3f(rayLog[i].o[0], rayLog[i].o[1], rayLog[i].o[2]);
      glVertex3f(end[0], end[1], end[2]);
    }
    glEnd();
  }

  glDepthMask(GL_TRUE);
  glPopAttrib();
}